

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeCommandLineExecutor.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_5480::CommandLine::~CommandLine(CommandLine *this)

{
  CommandLine *this_local;
  
  std::__cxx11::string::~string((string *)&this->infoFile);
  std::__cxx11::string::~string((string *)&this->outFile);
  std::__cxx11::string::~string((string *)&this->inFile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->exclude);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->testset);
  std::__cxx11::string::~string((string *)&this->caseListDir);
  std::__cxx11::string::~string((string *)&this->serverBinOrAddress);
  xe::TargetConfiguration::~TargetConfiguration(&this->targetCfg);
  return;
}

Assistant:

CommandLine (void)
		: port		(0)
		, summary	(false)
	{
	}